

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O3

void sysbvm_functionBytecodeAssembler_lowerTemporaryPointerRank
               (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
               sysbvm_tuple_t operand)

{
  _Bool _Var1;
  size_t sVar2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  
  uVar4 = operand & 0xf;
  if (uVar4 == 0 && operand != 0) {
    sVar3 = *(sysbvm_tuple_t *)operand;
  }
  else if ((int)uVar4 == 0xf) {
    sVar3 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,operand >> 4);
  }
  else {
    sVar3 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar4);
  }
  if (((sVar3 == (context->roots).functionBytecodeAssemblerVectorOperand) &&
      (*(long *)(operand + 0x50) != 0x1f)) &&
     ((*(ulong *)(operand + 0x10) & 0x80000) == 0 &&
      ((uint)*(undefined8 *)(operand + 0x18) & 0xffff0) == 0x30)) {
    uVar4 = (ulong)((uint)*(ulong *)(operand + 0x10) >> 4 & 0x7fff);
    sVar2 = sysbvm_orderedCollection_getSize(assembler->temporaries);
    if (uVar4 < sVar2) {
      sVar3 = sysbvm_orderedCollection_at(assembler->temporaryTypes,uVar4);
      _Var1 = sysbvm_tuple_isKindOf(context,sVar3,(context->roots).pointerLikeType);
      if (!_Var1) {
        sysbvm_error("Expected a pointer like type for alloca which is going to be lowered.");
      }
      sysbvm_orderedCollection_atPut
                (assembler->temporaryTypes,uVar4,*(sysbvm_tuple_t *)(sVar3 + 0xf8));
      return;
    }
  }
  return;
}

Assistant:

static void sysbvm_functionBytecodeAssembler_lowerTemporaryPointerRank(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t operand)
{
    if(sysbvm_tuple_getType(context, operand) != context->roots.functionBytecodeAssemblerVectorOperand)
        return;

    sysbvm_functionBytecodeAssemblerVectorOperand_t *vectorOperand = (sysbvm_functionBytecodeAssemblerVectorOperand_t*)operand;
    if(sysbvm_tuple_boolean_decode(vectorOperand->allocaPointerRankIsLowered))
        return;

    int16_t index = sysbvm_tuple_int16_decode(vectorOperand->index);
    int16_t vectorType = sysbvm_tuple_int16_decode(vectorOperand->vectorType);
    if(vectorType != SYSBVM_OPERAND_VECTOR_LOCAL || index < 0 || (size_t)index >= sysbvm_orderedCollection_getSize(assembler->temporaries))
        return;

    sysbvm_tuple_t temporaryType = sysbvm_orderedCollection_at(assembler->temporaryTypes, index);
    if(!sysbvm_tuple_isKindOf(context, temporaryType, context->roots.pointerLikeType))
        sysbvm_error("Expected a pointer like type for alloca which is going to be lowered.");

    sysbvm_tuple_t baseType = ((sysbvm_pointerLikeType_t*)temporaryType)->baseType;
    sysbvm_orderedCollection_atPut(assembler->temporaryTypes, index, baseType);
}